

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool medit_gold(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  void *pvVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  char *txt;
  
  bVar3 = 1;
  do {
    bVar5 = bVar3;
    cVar1 = *argument;
    if (cVar1 == '\0') {
      txt = "Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r";
      goto LAB_003a5549;
    }
    pvVar2 = ch->desc->pEdit;
    iVar4 = flag_lookup(argument,wealth_table);
    argument = "";
    bVar3 = 0;
  } while (iVar4 == -99);
  *(int *)((long)pvVar2 + 0x120) = iVar4;
  txt = "Wealth set.\n\r";
LAB_003a5549:
  send_to_char(txt,ch);
  return (bool)(bVar5 & cVar1 != '\0');
}

Assistant:

bool medit_gold(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int index;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r", ch);
		return false;
	}

	index = flag_lookup(argument, wealth_table);

	if (index == NO_FLAG)
	{
		medit_gold(ch, "");
		return false;
	}

	pMob->wealth = index;
	send_to_char("Wealth set.\n\r", ch);
	return true;
}